

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDEdgeChain::RemoveEdges(ON_SubDEdgeChain *this,ON_SubDEdge *first_edge,ON_SubDEdge *last_edge)

{
  uint uVar1;
  uint count;
  ON_SubDEdgePtr *pOVar2;
  ON_SubDEdge *pOVar3;
  ON_SubDEdgePtr *pOVar4;
  ON_SubDVertex *pOVar5;
  ON_SubDVertex *pOVar6;
  bool bVar7;
  uint local_40;
  uint local_3c;
  uint i_1;
  uint i;
  uint count1;
  uint i1;
  uint i0;
  uint count0;
  ON_SubDEdge *last_edge_local;
  ON_SubDEdge *first_edge_local;
  ON_SubDEdgeChain *this_local;
  
  uVar1 = ON_SimpleArray<ON_SubDEdgePtr>::UnsignedCount(&this->m_edge_chain);
  count1 = 0;
  if (first_edge != (ON_SubDEdge *)0x0) {
    while( true ) {
      bVar7 = false;
      if (count1 < uVar1) {
        pOVar2 = ON_SimpleArray<ON_SubDEdgePtr>::operator[](&this->m_edge_chain,count1);
        pOVar3 = ON_SubDEdgePtr::Edge(pOVar2);
        bVar7 = first_edge != pOVar3;
      }
      if (!bVar7) break;
      count1 = count1 + 1;
    }
  }
  i = uVar1;
  if (last_edge != (ON_SubDEdge *)0x0) {
    while( true ) {
      bVar7 = false;
      if (count1 < i) {
        pOVar2 = ON_SimpleArray<ON_SubDEdgePtr>::operator[](&this->m_edge_chain,i - 1);
        pOVar3 = ON_SubDEdgePtr::Edge(pOVar2);
        bVar7 = last_edge != pOVar3;
      }
      if (!bVar7) break;
      i = i - 1;
    }
  }
  count = i - count1;
  if (count < uVar1) {
    if (count1 != 0) {
      for (local_3c = count1; local_3c < i; local_3c = local_3c + 1) {
        pOVar2 = ON_SimpleArray<ON_SubDEdgePtr>::operator[](&this->m_edge_chain,local_3c);
        pOVar4 = ON_SimpleArray<ON_SubDEdgePtr>::operator[](&this->m_edge_chain,local_3c - count1);
        pOVar4->m_ptr = pOVar2->m_ptr;
      }
    }
    ON_SimpleArray<ON_SubDEdgePtr>::SetCount(&this->m_edge_chain,count);
    ON_UniqueTester::ClearList(&this->m_unique_tester);
    for (local_40 = 0; local_40 < count; local_40 = local_40 + 1) {
      pOVar2 = ON_SimpleArray<ON_SubDEdgePtr>::operator[](&this->m_edge_chain,local_40);
      pOVar3 = ON_SubDEdgePtr::Edge(pOVar2);
      ON_UniqueTester::AddToList(&this->m_unique_tester,(ON__UINT_PTR)pOVar3);
      pOVar2 = ON_SimpleArray<ON_SubDEdgePtr>::operator[](&this->m_edge_chain,local_40);
      pOVar5 = ON_SubDEdgePtr::RelativeVertex(pOVar2,0);
      ON_UniqueTester::AddToList(&this->m_unique_tester,(ON__UINT_PTR)pOVar5);
    }
    pOVar5 = FirstVertex(this);
    pOVar6 = LastVertex(this);
    if (pOVar5 != pOVar6) {
      pOVar5 = LastVertex(this);
      ON_UniqueTester::AddToList(&this->m_unique_tester,(ON__UINT_PTR)pOVar5);
    }
    this_local._4_4_ = uVar1 - count;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_SubDEdgeChain::RemoveEdges(
  const ON_SubDEdge* first_edge,
  const ON_SubDEdge* last_edge
) 
{
  unsigned int count0 = m_edge_chain.UnsignedCount();
  unsigned int i0 = 0;
  unsigned int i1 = count0;
  if (nullptr != first_edge)
  {
    while (i0 < count0 && first_edge != m_edge_chain[i0].Edge())
      ++i0;
  }
  if (nullptr != last_edge)
  {
    while (i1 > i0 && last_edge != m_edge_chain[i1 - 1].Edge())
      --i1;
  }

  const unsigned int count1 = i1 - i0;
  if (count1 >= count0)
    return 0;

  if (i0 > 0)
  {
    for (unsigned int i = i0; i < i1; i++)
      m_edge_chain[i - i0] = m_edge_chain[i];
  }

  m_edge_chain.SetCount(count1);
  m_unique_tester.ClearList();
  for (unsigned int i = 0; i < count1; i++)
  {
    m_unique_tester.AddToList((ON__UINT_PTR)m_edge_chain[i].Edge());
    m_unique_tester.AddToList((ON__UINT_PTR)m_edge_chain[i].RelativeVertex(0));
  }
  if ( FirstVertex() != LastVertex() )
    m_unique_tester.AddToList((ON__UINT_PTR)LastVertex());

  return count0 - count1;
}